

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.cpp
# Opt level: O2

int __thiscall OrderMoney::amount(OrderMoney *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*((this->a).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Money[3])
            (&local_60);
  (*((this->b).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Money[3])
            (&local_40);
  bVar1 = std::operator!=(&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar1) {
    iVar2 = (*((this->a).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Money[2])();
    iVar3 = (*((this->b).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Money[2])();
    return iVar3 + iVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Multicurrency operations without convert");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int OrderMoney::amount() const
{
	if (a->currency() != b->currency()) {
		throw runtime_error("Multicurrency operations without convert");
	}
	return a->amount() + b->amount();
}